

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::readArrayBasedContainer<QList<unsigned_long_long>>
          (QDataStream *s,QList<unsigned_long_long> *c)

{
  long lVar1;
  Status SVar2;
  qint64 qVar3;
  QList<unsigned_long_long> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  qsizetype i;
  qsizetype n;
  qint64 size;
  value_type_conflict7 t;
  StreamStateSaver stateSaver;
  QDataStream *in_stack_ffffffffffffff98;
  StreamStateSaver *in_stack_ffffffffffffffa0;
  long local_58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  StreamStateSaver::StreamStateSaver(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  QList<unsigned_long_long>::clear((QList<unsigned_long_long> *)in_stack_ffffffffffffffa0);
  qVar3 = QDataStream::readQSizeType((QDataStream *)in_stack_ffffffffffffffa0);
  if (qVar3 < 0) {
    QDataStream::setStatus((Status)in_RDI);
  }
  else {
    QList<unsigned_long_long>::reserve(in_RSI,in_stack_00000008);
    for (local_58 = 0; local_58 < qVar3; local_58 = local_58 + 1) {
      QDataStream::operator>>
                ((QDataStream *)in_stack_ffffffffffffffa0,(quint64 *)in_stack_ffffffffffffff98);
      SVar2 = QDataStream::status(in_RDI);
      if (SVar2 != Ok) {
        QList<unsigned_long_long>::clear((QList<unsigned_long_long> *)in_stack_ffffffffffffffa0);
        break;
      }
      QList<unsigned_long_long>::append
                ((QList<unsigned_long_long> *)0x20dd30,(parameter_type)in_stack_ffffffffffffff98);
    }
  }
  StreamStateSaver::~StreamStateSaver(in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}